

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *
protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message
          (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  bool bVar1;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *ret;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *default_val;
  upb_MiniTableField field;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *local_28;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *local_20;
  upb_MiniTableField local_18;
  
  local_20 = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)0x0;
  local_18.number_dont_copy_me__upb_internal_use_only = 0x12;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x138;
  local_18.presence = 0x4f;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc2;
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,&local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return local_20;
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,&local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return local_28;
}

Assistant:

UPB_INLINE const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* default_val = NULL;
  const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* ret;
  const upb_MiniTableField field = {18, UPB_SIZE(44, 312), 79, 0, 11, (int)kUpb_FieldMode_Scalar | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}